

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_extended_errcode(sqlite3 *db)

{
  int iVar1;
  sqlite3 *db_local;
  
  if ((db != (sqlite3 *)0x0) && (iVar1 = sqlite3SafetyCheckSickOrOk(db), iVar1 == 0)) {
    iVar1 = sqlite3MisuseError(0x23230);
    return iVar1;
  }
  if ((db == (sqlite3 *)0x0) || (db->mallocFailed != '\0')) {
    db_local._4_4_ = 7;
  }
  else {
    db_local._4_4_ = db->errCode;
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_extended_errcode(sqlite3 *db){
  if( db && !sqlite3SafetyCheckSickOrOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  if( !db || db->mallocFailed ){
    return SQLITE_NOMEM_BKPT;
  }
  return db->errCode;
}